

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UBool icu_63::DateFormatSymbols::arrayCompare
                (UnicodeString *array1,UnicodeString *array2,int32_t count)

{
  UBool UVar1;
  int local_24;
  int32_t count_local;
  UnicodeString *array2_local;
  UnicodeString *array1_local;
  
  local_24 = count;
  if (array1 == array2) {
    array1_local._7_1_ = '\x01';
  }
  else {
    do {
      if (local_24 < 1) {
        return '\x01';
      }
      local_24 = local_24 + -1;
      UVar1 = icu_63::UnicodeString::operator!=(array1 + local_24,array2 + local_24);
    } while (UVar1 == '\0');
    array1_local._7_1_ = '\0';
  }
  return array1_local._7_1_;
}

Assistant:

UBool
DateFormatSymbols::arrayCompare(const UnicodeString* array1,
                                const UnicodeString* array2,
                                int32_t count)
{
    if (array1 == array2) return TRUE;
    while (count>0)
    {
        --count;
        if (array1[count] != array2[count]) return FALSE;
    }
    return TRUE;
}